

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLimit.cpp
# Opt level: O2

void __thiscall chrono::ChLinkLimit::ArchiveOUT(ChLinkLimit *this,ChArchiveOut *marchive)

{
  ChNameValue<std::shared_ptr<chrono::ChFunction>_> local_1e0;
  ChNameValue<std::shared_ptr<chrono::ChFunction>_> local_1c8;
  ChNameValue<std::shared_ptr<chrono::ChFunction>_> local_1b0;
  ChNameValue<std::shared_ptr<chrono::ChFunction>_> local_198;
  ChNameValue<std::shared_ptr<chrono::ChFunction>_> local_180;
  ChNameValue<double> local_168;
  ChNameValue<double> local_150;
  ChNameValue<double> local_138;
  ChNameValue<double> local_120;
  ChNameValue<double> local_108;
  ChNameValue<double> local_f0;
  ChNameValue<double> local_d8;
  ChNameValue<double> local_c0;
  ChNameValue<double> local_a8;
  ChNameValue<double> local_90;
  ChNameValue<bool> local_78;
  ChNameValue<bool> local_60;
  ChNameValue<bool> local_48;
  ChNameValue<bool> local_30;
  
  ChArchiveOut::VersionWrite<chrono::ChLinkLimit>(marchive);
  local_30._value = &this->m_active;
  local_30._name = "m_active";
  local_30._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_30);
  local_48._value = &this->m_penalty_only;
  local_48._name = "m_penalty_only";
  local_48._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_48);
  local_60._value = &this->m_polar;
  local_60._name = "m_polar";
  local_60._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_60);
  local_78._value = &this->m_rotation;
  local_78._name = "m_rotation";
  local_78._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_78);
  local_90._value = &this->m_max;
  local_90._name = "m_max";
  local_90._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_90);
  local_a8._value = &this->m_min;
  local_a8._name = "m_min";
  local_a8._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_a8);
  local_c0._value = &this->m_maxCushion;
  local_c0._name = "m_maxCushion";
  local_c0._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_c0);
  local_d8._value = &this->m_minCushion;
  local_d8._name = "m_minCushion";
  local_d8._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_d8);
  local_f0._value = &this->m_Kmax;
  local_f0._name = "m_Kmax";
  local_f0._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_f0);
  local_108._value = &this->m_Kmin;
  local_108._name = "m_Kmin";
  local_108._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_108);
  local_120._value = &this->m_Rmax;
  local_120._name = "m_Rmax";
  local_120._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_120);
  local_138._value = &this->m_Rmin;
  local_138._name = "m_Rmin";
  local_138._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_138);
  local_150._value = &this->m_maxElastic;
  local_150._name = "m_maxElastic";
  local_150._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_150);
  local_168._value = &this->m_minElastic;
  local_168._name = "m_minElastic";
  local_168._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_168);
  local_180._value = &this->m_Kmax_modul;
  local_180._name = "m_Kmax_modul";
  local_180._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_180);
  local_198._value = &this->m_Kmin_modul;
  local_198._name = "m_Kmin_modul";
  local_198._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_198);
  local_1b0._value = &this->m_Rmax_modul;
  local_1b0._name = "m_Rmax_modul";
  local_1b0._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_1b0);
  local_1c8._value = &this->m_Rmin_modul;
  local_1c8._name = "m_Rmin_modul";
  local_1c8._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_1c8);
  local_1e0._value = &this->m_polarMax_funct;
  local_1e0._name = "m_polarMax_funct";
  local_1e0._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_1e0);
  return;
}

Assistant:

void ChLinkLimit::ArchiveOUT(ChArchiveOut& marchive) {
    // class version number
    marchive.VersionWrite<ChLinkLimit>();

    // stream out all member data
    marchive << CHNVP(m_active);
    marchive << CHNVP(m_penalty_only);
    marchive << CHNVP(m_polar);
    marchive << CHNVP(m_rotation);
    marchive << CHNVP(m_max);
    marchive << CHNVP(m_min);
    marchive << CHNVP(m_maxCushion);
    marchive << CHNVP(m_minCushion);
    marchive << CHNVP(m_Kmax);
    marchive << CHNVP(m_Kmin);
    marchive << CHNVP(m_Rmax);
    marchive << CHNVP(m_Rmin);
    marchive << CHNVP(m_maxElastic);
    marchive << CHNVP(m_minElastic);
    marchive << CHNVP(m_Kmax_modul);
    marchive << CHNVP(m_Kmin_modul);
    marchive << CHNVP(m_Rmax_modul);
    marchive << CHNVP(m_Rmin_modul);
    marchive << CHNVP(m_polarMax_funct);
}